

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O3

void __thiscall LongReadsDatastore::print_status(LongReadsDatastore *this)

{
  unsigned_long uVar1;
  pointer puVar2;
  ostream *poVar3;
  pointer pRVar4;
  ostream *poVar5;
  long lVar6;
  pointer pRVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  ulong uVar8;
  unsigned_long *puVar9;
  pointer puVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  LongReadsDatastore *local_88;
  double local_80;
  double local_78;
  unsigned_long *local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  poVar3 = sdglib::OutputLog(INFO,false);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  pRVar4 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar7 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_88 = this;
  if ((long)pRVar7 - (long)pRVar4 == 0x10) {
    lVar12 = 0;
  }
  else {
    lVar11 = 0x18;
    uVar8 = 0;
    lVar12 = 0;
    do {
      puVar9 = (unsigned_long *)(ulong)*(uint *)((long)&pRVar4->offset + lVar11);
      local_70 = puVar9;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_70);
        pRVar4 = (local_88->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pRVar7 = (local_88->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)puVar9;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar2 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = lVar12 + (long)puVar9;
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar8 < ((long)pRVar7 - (long)pRVar4 >> 4) - 1U);
    if ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      local_70 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_38 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar8 = (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar11 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_70,&local_38,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      local_40 = puVar10;
      local_48 = puVar2;
      std::
      __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
  }
  poVar5 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"The datastore on ",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(local_88->filename)._M_dataplus._M_p,
                      (local_88->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," contains ",10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," reads with ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp, ",4);
  puVar2 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    auVar13._8_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar13._0_8_ = lVar12;
    auVar13._12_4_ = 0x45300000;
    dStack_60 = auVar13._8_8_ - 1.9342813113834067e+25;
    local_68 = dStack_60 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
    local_78 = local_68 * 0.2;
    local_80 = local_68 * 0.5;
    local_68 = local_68 * 0.8;
    lVar11 = 0;
    puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar10;
      if (lVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"N0: ",4);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp  ",4);
      }
      auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = 0x45300000;
      dStack_50 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      if ((local_58 < local_78) &&
         (lVar6 = uVar1 + lVar11, auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar15._0_8_ = lVar6
         , auVar15._12_4_ = 0x45300000,
         local_78 <
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"N20: ",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp  ",4);
      }
      if ((local_58 < local_80) &&
         (lVar6 = uVar1 + lVar11, auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar16._0_8_ = lVar6
         , auVar16._12_4_ = 0x45300000,
         local_80 <
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"N50: ",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp  ",4);
      }
      lVar11 = lVar11 + uVar1;
      auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = 0x45300000;
      if ((local_58 < local_68) &&
         (local_68 <
          (auVar17._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"N80: ",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp  ",4);
      }
      if (lVar11 == lVar12) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"N100: ",6);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bp  ",4);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  LongReadsMapper::print_status(&local_88->mapper);
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LongReadsDatastore::print_status() const {
    auto &log_no_date=sdglib::OutputLog(sdglib::LogLevels::INFO,false);
    std::vector<uint64_t> read_sizes;
    uint64_t total_size=0;
    for (auto ri=1;ri<=size();++ri) {
        auto s=read_to_fileRecord[ri].record_size;
            total_size += s;
            read_sizes.push_back(s);
    }
    std::sort(read_sizes.rbegin(),read_sizes.rend());
    auto on20s=total_size*.2;
    auto on50s=total_size*.5;
    auto on80s=total_size*.8;
    sdglib::OutputLog() <<"The datastore on " << filename << " contains "<<read_sizes.size()<<" reads with "<<total_size<<"bp, ";
    uint64_t acc=0;
    for (auto s:read_sizes){
        if (acc==0)  log_no_date<<"N0: "<<s<<"bp  ";
        if (acc<on20s and acc+s>on20s) log_no_date<<"N20: "<<s<<"bp  ";
        if (acc<on50s and acc+s>on50s) log_no_date<<"N50: "<<s<<"bp  ";
        if (acc<on80s and acc+s>on80s) log_no_date<<"N80: "<<s<<"bp  ";
        acc+=s;
        if (acc==total_size)  log_no_date<<"N100: "<<s<<"bp  ";
    }
    log_no_date<<std::endl;

    mapper.print_status();
}